

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O1

void makerooms(level *lev,int levstyle)

{
  int iVar1;
  int iVar2;
  xchar xVar3;
  boolean bVar4;
  uint uVar5;
  uint uVar6;
  nhrect *pnVar7;
  byte bVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  char cVar16;
  int iVar17;
  long lVar18;
  bool bVar19;
  bool bVar20;
  xchar width;
  byte local_6c;
  xchar ly;
  xchar lx;
  char local_69;
  int local_68;
  nhrect r2;
  
  uVar5 = mt_random();
  if (levstyle == 4) {
    uVar6 = mt_random();
    bVar19 = (uVar6 & 3) == 0;
    iVar17 = (int)(0x50 / (ulong)((uVar5 % 3) * 2 + 10));
    bVar8 = 2 - bVar19;
    local_68 = uVar5 % 3 + 3;
    iVar15 = 0;
    do {
      iVar14 = 0;
      do {
        smeq[lev->nroom] = lev->nroom;
        iVar1 = iVar14 + 2;
        iVar2 = lev->nroom;
        do_room_or_subroom(lev,lev->rooms + iVar2,(iVar15 * 2 + 1) * iVar17 + iVar15 * 2,
                           (iVar14 + 1 << (bVar8 & 0x1f)) + iVar14,
                           (iVar15 * 2 + 2) * iVar17 + iVar15 * 2,(iVar1 << (bVar8 & 0x1f)) + iVar14
                           ,'\x01','\0','\0','\x01');
        lev->rooms[(long)iVar2 + 1].hx = -1;
        lev->nroom = lev->nroom + 1;
        iVar14 = iVar1;
      } while ((uint)bVar19 * 2 + 4 != iVar1);
      bVar20 = iVar15 != local_68;
      iVar15 = iVar15 + 1;
    } while (bVar20);
  }
  else if (lev->nroom < 0x28) {
    bVar20 = 0x19999999 <
             (uVar5 * -0x33333333 >> 1 | (uint)((uVar5 * -0x33333333 & 1) != 0) << 0x1f);
    iVar15 = 5;
    bVar19 = false;
    do {
      while( true ) {
        pnVar7 = rnd_rect();
        if (pnVar7 == (nhrect *)0x0) {
          return;
        }
        if ((lev->nroom <= iVar15) || (uVar5 = mt_random(), bVar19 || (uVar5 & 1) == 0)) break;
        bVar4 = create_room(lev,-1,-1,'\x02','\x02',-1,-1,'\x04','\x01');
        bVar19 = true;
        if (bVar4 != '\0') {
          iVar17 = lev->nroom;
          vault_x = lev->rooms[iVar17].lx;
          vault_y = lev->rooms[iVar17].ly;
          lev->rooms[iVar17].hx = -1;
        }
LAB_001d9abd:
        if (0x27 < lev->nroom) {
          return;
        }
      }
      if ((bVar20) || ((0x26 < lev->nroom || (pnVar7 = rnd_rect(), pnVar7 == (nhrect *)0x0)))) {
LAB_001d9a86:
        bVar4 = create_room(lev,-1,-1,-1,-1,-1,-1,'\0',-1);
        if (bVar4 == '\0') {
          return;
        }
        goto LAB_001d9abd;
      }
      cVar12 = pnVar7->lx;
      cVar16 = pnVar7->ly;
      if (cVar12 < '\x01') {
        uVar5 = 0xfffffffb;
      }
      else {
        uVar5 = (uint)('N' < pnVar7->hx) * 3 | 0xfffffff8;
      }
      if (cVar16 < '\x01') {
        iVar17 = -4;
      }
      else {
        iVar17 = (uint)('\x13' < pnVar7->hy) * 2 + -6;
      }
      uVar6 = mt_random();
      width = ((byte)uVar6 & 7) + 5;
      uVar6 = mt_random();
      local_6c = ((byte)uVar6 & 1) + 5;
      cVar10 = pnVar7->lx;
      cVar9 = cVar10;
      if (cVar10 < '\x01') {
        cVar9 = '\x03';
      }
      iVar14 = (uVar5 + (int)pnVar7->hx) - ((int)width + (int)cVar9);
      cVar9 = pnVar7->ly;
      if (pnVar7->ly < '\x01') {
        cVar9 = '\x02';
      }
      if ((iVar14 < -1) ||
         (iVar17 = (iVar17 + pnVar7->hy) - ((uint)local_6c + (int)cVar9), iVar17 < -1))
      goto LAB_001d9a86;
      iVar14 = iVar14 + 1;
      if (iVar14 == 0) {
        cVar9 = '\0';
      }
      else {
        uVar5 = mt_random();
        cVar9 = SUB161(ZEXT416(uVar5) % SEXT816((long)iVar14),0);
      }
      iVar17 = iVar17 + 1;
      lx = ('\0' < cVar12) + '\x03' + cVar10 + cVar9;
      cVar12 = pnVar7->ly;
      if (iVar17 == 0) {
        cVar10 = '\0';
      }
      else {
        uVar5 = mt_random();
        cVar10 = SUB161(ZEXT416(uVar5) % SEXT816((long)iVar17),0);
      }
      ly = ('\0' < cVar16 | 2U) + cVar12 + cVar10;
      bVar4 = check_room(lev,&lx,&width,&ly,(xchar *)&local_6c,'\0');
      if ((bVar4 == '\0') || ((char)local_6c < '\x05' || width < '\x05')) goto LAB_001d9a86;
      r2.lx = lx + -1;
      r2.ly = ly + -1;
      r2.hx = width + lx + '\x01';
      r2.hy = local_6c + ly + '\x01';
      split_rects(pnVar7,&r2);
      xVar3 = width;
      iVar17 = (int)lx;
      iVar15 = (int)ly;
      lVar13 = (long)width;
      lVar18 = (long)(char)local_6c;
      uVar5 = mt_random();
      if (SUB164(ZEXT416(uVar5) % SEXT816(lVar18 + lVar13),0) < (int)xVar3) {
        cVar16 = lx + width / '\x02';
        cVar12 = cVar16 + -1;
        cVar11 = local_6c + ly;
        cVar9 = cVar16 + '\x01';
        local_69 = cVar11;
        cVar16 = cVar16 + width / '\x02';
        cVar10 = ly;
      }
      else {
        cVar12 = width + lx;
        local_69 = ly + (char)local_6c / '\x02';
        cVar11 = local_69 + -1;
        cVar10 = local_69 + '\x01';
        local_69 = local_69 + (char)local_6c / '\x02';
        cVar9 = lx;
        cVar16 = cVar12;
      }
      local_68 = CONCAT31(local_68._1_3_,cVar16);
      bVar8 = depth(&lev->z);
      uVar5 = mt_random();
      bVar20 = false;
      if (uVar5 % (uint)(byte)(((bVar8 ^ (char)bVar8 >> 7) - ((char)bVar8 >> 7)) + 1) < 10) {
        uVar5 = mt_random();
        bVar20 = 0x3531dec < uVar5 * 0x3f2b3885;
      }
      iVar14 = lev->nroom;
      do_room_or_subroom(lev,lev->rooms + iVar14,iVar17,iVar15,(int)cVar12,(int)cVar11,bVar20,'\0',
                         '\0','\x01');
      lev->rooms[(long)iVar14 + 1].hx = -1;
      iVar15 = lev->nroom;
      lev->nroom = iVar15 + 1;
      smeq[iVar15] = iVar15;
      iVar17 = lev->nroom;
      do_room_or_subroom(lev,lev->rooms + iVar17,(int)cVar9,(int)cVar10,(int)(char)local_68,
                         (int)local_69,bVar20,'\0','\0','\x01');
      lev->rooms[(long)iVar17 + 1].hx = -1;
      iVar17 = lev->nroom;
      lev->nroom = iVar17 + 1;
      smeq[iVar17] = iVar17;
      join(lev,iVar15,iVar17,'\0');
      iVar15 = 6;
      bVar20 = true;
    } while (lev->nroom < 0x28);
  }
  return;
}

Assistant:

static void makerooms(struct level *lev, int levstyle)
{
	boolean tried_vault, do_splitrm, did_splitrm;

	/*
	 * It's worth noting that some level styles have particular weaknesses.
	 * For example, LEVSTYLE_RING has no shops since all rooms have 2 doors,
	 * and LEVSTYLE_GRID leaves no room for vaults or split rooms.
	 */

	if (levstyle == LEVSTYLE_GRID) {
	    int grid_width = rn1(3, 4);
	    int grid_height = rn2(4) ? 2 : 3;
	    int room_width = COLNO / ((grid_width + 1) * 2);
	    int room_height = (grid_height == 2) ? 4 : 2;
	    int x, y;

	    /* make grid rooms in column-major order */
	    for (x = 0; x < grid_width; x++) {
		for (y = 0; y < grid_height; y++) {
		    /*
		     * create_room() does not handle the regular grid pattern well;
		     * the room position parameter is not precise enough.
		     * So we'll do it the old-fashioned way.
		     */
		    smeq[lev->nroom] = lev->nroom;
		    add_room(lev,
			     (2 * x + 1) * room_width + 2 * x,
			     (2 * y + 1) * room_height + 2 * y,
			     (2 * x + 2) * room_width + 2 * x,
			     (2 * y + 2) * room_height + 2 * y,
			     TRUE, OROOM, FALSE);
		}
	    }

	    /* No room for a vault.  Don't bother trying. */
	    return;
	}

	/* make rooms until satisfied */
	tried_vault = FALSE;
	do_splitrm = !rn2(10);
	did_splitrm = FALSE;
	/* rnd_rect() will returns 0 if no more rects are available... */
	while (lev->nroom < MAXNROFROOMS && rnd_rect()) {
		/* don't double-count split room halves when limiting room count */
		if (lev->nroom - (did_splitrm ? 1 : 0) >= MAXNROFROOMS / 6 &&
		    rn2(2) && !tried_vault) {
			tried_vault = TRUE;
			if (create_vault(lev)) {
				vault_x = lev->rooms[lev->nroom].lx;
				vault_y = lev->rooms[lev->nroom].ly;
				lev->rooms[lev->nroom].hx = -1;
			}
		} else {
		    if (do_splitrm && lev->nroom + 1 < MAXNROFROOMS) {
			if (mk_split_room(lev)) {
			    do_splitrm = FALSE;
			    did_splitrm = TRUE;
			    continue;
			}
		    }
		    if (!create_room(lev, -1, -1, -1, -1, -1, -1, OROOM, -1))
			return;
		}
	}
	return;
}